

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudDrv_ALSA.c
# Opt level: O0

UINT8 WriteBuffer(DRV_ALSA *drv,UINT32 dataSize,void *data)

{
  int local_24;
  int retVal;
  void *data_local;
  UINT32 dataSize_local;
  DRV_ALSA *drv_local;
  
  do {
    local_24 = snd_pcm_writei(drv->hPCM,data,(ulong)dataSize / (ulong)(drv->waveFmt).nBlockAlign);
  } while (local_24 == -0xb);
  if (local_24 == -0x56) {
    local_24 = snd_pcm_resume(drv->hPCM);
    while (local_24 == -0xb) {
      usleep(1000);
      local_24 = snd_pcm_resume(drv->hPCM);
    }
    if (local_24 < 0) {
      local_24 = -0x20;
    }
  }
  if (local_24 == -0x20) {
    snd_pcm_prepare(drv->hPCM);
  }
  return '\0';
}

Assistant:

static UINT8 WriteBuffer(DRV_ALSA* drv, UINT32 dataSize, void* data)
{
	int retVal;
	
	do
	{
		retVal = snd_pcm_writei(drv->hPCM, data, dataSize / drv->waveFmt.nBlockAlign);
	} while (retVal == -EAGAIN);
	if (retVal == -ESTRPIPE)
	{
		retVal = snd_pcm_resume(drv->hPCM);
		while(retVal == -EAGAIN)
		{
			Sleep(1);
			retVal = snd_pcm_resume(drv->hPCM);
		}
		if (retVal < 0)
			retVal = -EPIPE;
	}
	if (retVal == -EPIPE)
	{
		// buffer underrun
		snd_pcm_prepare(drv->hPCM);
	}
	
	return AERR_OK;
}